

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSource(FileGenerator *this,Printer *printer)

{
  string *value1;
  pointer ppMVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  pointer ppSVar4;
  pointer ppSVar5;
  pointer ppMVar6;
  pointer ppEVar7;
  FileGenerator *this_00;
  Printer *pPVar8;
  bool bVar9;
  byte bVar10;
  FileDescriptor *pFVar11;
  int i;
  int i_00;
  char *pcVar12;
  long lVar13;
  unsigned_long i_01;
  unsigned_long extraout_RDX;
  unsigned_long i_02;
  int index;
  MessageGenerator *pMVar14;
  int i_3;
  ulong uVar15;
  int i_4;
  char *__s;
  int i_2;
  string dependency;
  allocator<char> local_a9;
  FileGenerator *local_a8;
  Options *local_a0;
  Printer *local_98;
  string local_90;
  string header;
  string local_50;
  
  bVar9 = IsWellKnownMessage(this->file_);
  StripProto(&dependency,*(string **)this->file_);
  pcVar12 = ".pb.h";
  if ((this->options_).proto_h != false) {
    pcVar12 = ".proto.h";
  }
  std::operator+(&header,&dependency,pcVar12);
  std::__cxx11::string::~string((string *)&dependency);
  value1 = *(string **)this->file_;
  pcVar12 = "<";
  __s = "\"";
  if (!bVar9) {
    pcVar12 = "\"";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dependency,pcVar12,(allocator<char> *)&local_50);
  if (bVar9) {
    __s = ">";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_a9);
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n#include $left$$header$$right$\n\n#include <algorithm>\n\n#include <google/protobuf/stubs/common.h>\n#include <google/protobuf/stubs/port.h>\n#include <google/protobuf/stubs/once.h>\n#include <google/protobuf/io/coded_stream.h>\n#include <google/protobuf/wire_format_lite_inl.h>\n"
                     ,"filename",value1,"header",&header,"left",&dependency,"right",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&dependency);
  bVar10 = (this->options_).enforce_lite;
  if ((((bool)bVar10 != false) || (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) == 3)) &&
     ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    io::Printer::Print(printer,"#include <google/protobuf/io/zero_copy_stream_impl_lite.h>\n");
    bVar10 = (this->options_).enforce_lite;
  }
  if (((bVar10 & 1) == 0) && (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(printer,
                       "#include <google/protobuf/descriptor.h>\n#include <google/protobuf/generated_message_reflection.h>\n#include <google/protobuf/reflection_ops.h>\n#include <google/protobuf/wire_format.h>\n"
                      );
  }
  if ((this->options_).proto_h == true) {
    for (index = 0; index < *(int *)(this->file_ + 0x18); index = index + 1) {
      pFVar11 = FileDescriptor::dependency(this->file_,index);
      StripProto(&local_90,*(string **)pFVar11);
      std::operator+(&dependency,&local_90,".proto.h");
      std::__cxx11::string::~string((string *)&local_90);
      io::Printer::Print(printer,"#include \"$dependency$\"\n","dependency",&dependency);
      std::__cxx11::string::~string((string *)&dependency);
    }
  }
  io::Printer::Print(printer,"// @@protoc_insertion_point(includes)\n");
  GenerateNamespaceOpeners(this,printer);
  local_a0 = &this->options_;
  local_a8 = this;
  local_98 = printer;
  for (uVar15 = 0; pPVar8 = local_98, this_00 = local_a8,
      ppMVar1 = (local_a8->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(local_a8->message_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3);
      uVar15 = uVar15 + 1) {
    dependency._M_dataplus._M_p = (pointer)&dependency.field_2;
    dependency._M_string_length = 0;
    dependency.field_2._M_local_buf[0] = '\0';
    pMVar14 = ppMVar1[uVar15];
    lVar13 = *(long *)(pMVar14->descriptor_ + 0x20);
    if (*(char *)(lVar13 + 0x6b) == '\x01') {
      ClassName_abi_cxx11_
                (&local_50,*(cpp **)(pMVar14->descriptor_ + 0x18),(Descriptor *)0x0,SUB81(lVar13,0))
      ;
      std::operator+(&local_90,&local_50,"::");
      std::__cxx11::string::operator=((string *)&dependency,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      pMVar14 = (local_a8->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15];
    }
    pPVar8 = local_98;
    io::Printer::Print(local_98,
                       "class $classname$DefaultTypeInternal : public ::google::protobuf::internal::ExplicitlyConstructed<$parent$$classname$> {\n"
                       ,"parent",&dependency,"classname",&pMVar14->classname_);
    io::Printer::Indent(pPVar8);
    MessageGenerator::GenerateExtraDefaultFields
              ((local_a8->message_generators_).
               super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15],pPVar8);
    io::Printer::Outdent(pPVar8);
    io::Printer::Print(pPVar8,"} _$classname$_default_instance_;\n","classname",
                       &(local_a8->message_generators_).
                        super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar15]->classname_);
    std::__cxx11::string::~string((string *)&dependency);
  }
  ppEVar2 = (local_a8->enum_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar3 = (local_a8->enum_generators_).
            super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (lVar13 = 0; (long)ppEVar3 - (long)ppEVar2 >> 3 != lVar13; lVar13 = lVar13 + 1) {
    ppEVar2[lVar13]->index_in_metadata_ = (int)lVar13;
  }
  bVar9 = HasGenericServices(local_a8->file_,local_a0);
  if (bVar9) {
    ppSVar4 = (this_00->service_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppSVar5 = (this_00->service_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (lVar13 = 0; (long)ppSVar5 - (long)ppSVar4 >> 3 != lVar13; lVar13 = lVar13 + 1) {
      ppSVar4[lVar13]->index_in_metadata_ = (int)lVar13;
    }
  }
  FileLevelNamespace(&dependency,*(string **)this_00->file_);
  io::Printer::Print(pPVar8,"\nnamespace $file_namespace$ {\n\n","file_namespace",&dependency);
  std::__cxx11::string::~string((string *)&dependency);
  if (((this_00->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(this_00->file_ + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(pPVar8,"\nnamespace {\n\n");
    ppMVar1 = (this_00->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppMVar6 = (this_00->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    i_02 = i_01;
    if (ppMVar1 != ppMVar6) {
      SimpleItoa_abi_cxx11_(&dependency,(protobuf *)((long)ppMVar6 - (long)ppMVar1 >> 3),i_01);
      io::Printer::Print(pPVar8,"::google::protobuf::Metadata file_level_metadata[$size$];\n","size"
                         ,&dependency);
      std::__cxx11::string::~string((string *)&dependency);
      i_02 = extraout_RDX;
    }
    ppEVar2 = (this_00->enum_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar3 = (this_00->enum_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar2 != ppEVar3) {
      SimpleItoa_abi_cxx11_(&dependency,(protobuf *)((long)ppEVar3 - (long)ppEVar2 >> 3),i_02);
      io::Printer::Print(pPVar8,
                         "const ::google::protobuf::EnumDescriptor* file_level_enum_descriptors[$size$];\n"
                         ,"size",&dependency);
      std::__cxx11::string::~string((string *)&dependency);
    }
    bVar9 = HasGenericServices(this_00->file_,local_a0);
    if ((bVar9) && (0 < (int)*(uint *)(this_00->file_ + 0x78))) {
      SimpleItoa_abi_cxx11_(&dependency,(protobuf *)(ulong)*(uint *)(this_00->file_ + 0x78),i_00);
      io::Printer::Print(pPVar8,
                         "const ::google::protobuf::ServiceDescriptor* file_level_service_descriptors[$size$];\n"
                         ,"size",&dependency);
      std::__cxx11::string::~string((string *)&dependency);
    }
    io::Printer::Print(pPVar8,"\n}  // namespace\n\n");
  }
  GenerateBuildDescriptors(this_00,pPVar8);
  FileLevelNamespace(&dependency,*(string **)this_00->file_);
  io::Printer::Print(pPVar8,"\n}  // namespace $file_namespace$\n\n","file_namespace",&dependency);
  std::__cxx11::string::~string((string *)&dependency);
  for (uVar15 = 0;
      ppEVar2 = (this_00->enum_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(this_00->enum_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3);
      uVar15 = uVar15 + 1) {
    EnumGenerator::GenerateMethods(ppEVar2[uVar15],pPVar8);
  }
  for (uVar15 = 0;
      uVar15 < (ulong)((long)(this_00->message_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->message_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar15 = uVar15 + 1) {
    io::Printer::Print(pPVar8,"\n");
    io::Printer::Print(pPVar8,
                       "// ===================================================================\n");
    io::Printer::Print(pPVar8,"\n");
    MessageGenerator::GenerateClassMethods
              ((this_00->message_generators_).
               super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15],pPVar8);
    io::Printer::Print(pPVar8,"#if PROTOBUF_INLINE_NOT_IN_HEADERS\n");
    MessageGenerator::GenerateInlineMethods
              ((this_00->message_generators_).
               super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15],pPVar8,false);
    io::Printer::Print(pPVar8,"#endif  // PROTOBUF_INLINE_NOT_IN_HEADERS\n");
  }
  bVar9 = HasGenericServices(this_00->file_,local_a0);
  if (bVar9) {
    for (uVar15 = 0;
        uVar15 < (ulong)((long)(this_00->service_generators_).
                               super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_00->service_generators_).
                               super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar15 = uVar15 + 1)
    {
      if (uVar15 == 0) {
        io::Printer::Print(pPVar8,"\n");
      }
      io::Printer::Print(pPVar8,
                         "// ===================================================================\n")
      ;
      io::Printer::Print(pPVar8,"\n");
      ServiceGenerator::GenerateImplementation
                ((this_00->service_generators_).
                 super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15],pPVar8);
    }
  }
  for (uVar15 = 0;
      ppEVar7 = (this_00->extension_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(this_00->extension_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar7 >> 3);
      uVar15 = uVar15 + 1) {
    ExtensionGenerator::GenerateDefinition(ppEVar7[uVar15],pPVar8);
  }
  io::Printer::Print(pPVar8,"\n// @@protoc_insertion_point(namespace_scope)\n");
  GenerateNamespaceClosers(this_00,pPVar8);
  io::Printer::Print(pPVar8,"\n// @@protoc_insertion_point(global_scope)\n");
  std::__cxx11::string::~string((string *)&header);
  return;
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  const bool use_system_include = IsWellKnownMessage(file_);
  string header =
      StripProto(file_->name()) + (options_.proto_h ? ".proto.h" : ".pb.h");
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n"
    // The generated code calls accessors that might be deprecated. We don't
    // want the compiler to warn in generated code.
    "#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n"
    "#include $left$$header$$right$\n"
    "\n"
    "#include <algorithm>\n"    // for swap()
    "\n"
    "#include <google/protobuf/stubs/common.h>\n"
    "#include <google/protobuf/stubs/port.h>\n"
    "#include <google/protobuf/stubs/once.h>\n"
    "#include <google/protobuf/io/coded_stream.h>\n"
    "#include <google/protobuf/wire_format_lite_inl.h>\n",
    "filename", file_->name(),
    "header", header,
    "left", use_system_include ? "<" : "\"",
    "right", use_system_include ? ">" : "\"");

  // Unknown fields implementation in lite mode uses StringOutputStream
  if (!UseUnknownFieldSet(file_, options_) && !message_generators_.empty()) {
    printer->Print(
      "#include <google/protobuf/io/zero_copy_stream_impl_lite.h>\n");
  }

  if (HasDescriptorMethods(file_, options_)) {
    printer->Print(
      "#include <google/protobuf/descriptor.h>\n"
      "#include <google/protobuf/generated_message_reflection.h>\n"
      "#include <google/protobuf/reflection_ops.h>\n"
      "#include <google/protobuf/wire_format.h>\n");
  }

  if (options_.proto_h) {
    // Use the smaller .proto.h files.
    for (int i = 0; i < file_->dependency_count(); i++) {
      const FileDescriptor* dep = file_->dependency(i);
      const char* extension = ".proto.h";
      string dependency = StripProto(dep->name()) + extension;
      printer->Print(
          "#include \"$dependency$\"\n",
          "dependency", dependency);
    }
  }

  printer->Print(
    "// @@protoc_insertion_point(includes)\n");

  GenerateNamespaceOpeners(printer);

  for (int i = 0; i < message_generators_.size(); i++) {
    string parent;
    if (IsMapEntryMessage(message_generators_[i]->descriptor_)) {
      parent = ClassName(message_generators_[i]->descriptor_->containing_type(),
                         false) +
               "::";
    }
    printer->Print(
        "class $classname$DefaultTypeInternal : "
        "public ::google::protobuf::internal::ExplicitlyConstructed<$parent$$classname$> "
        "{\n",
        "parent", parent, "classname", message_generators_[i]->classname_);
    printer->Indent();
    message_generators_[i]->GenerateExtraDefaultFields(printer);
    printer->Outdent();
    printer->Print(
        "} _$classname$_default_instance_;\n",
        "classname", message_generators_[i]->classname_);
  }

  for (int i = 0; i < enum_generators_.size(); i++) {
    enum_generators_[i]->index_in_metadata_ = i;
  }
  if (HasGenericServices(file_, options_)) {
    for (int i = 0; i < service_generators_.size(); i++) {
      service_generators_[i]->index_in_metadata_ = i;
    }
  }

  printer->Print(
      "\n"
      "namespace $file_namespace$ {\n"
      "\n",
      "file_namespace", FileLevelNamespace(file_->name()));

  if (HasDescriptorMethods(file_, options_)) {
    printer->Print(
      "\n"
      "namespace {\n"
      "\n");

    if (!message_generators_.empty()) {
      printer->Print("::google::protobuf::Metadata file_level_metadata[$size$];\n",
                     "size", SimpleItoa(message_generators_.size()));
    }
    if (!enum_generators_.empty()) {
      printer->Print(
          "const ::google::protobuf::EnumDescriptor* "
          "file_level_enum_descriptors[$size$];\n",
          "size", SimpleItoa(enum_generators_.size()));
    }
    if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
      printer->Print(
          "const ::google::protobuf::ServiceDescriptor* "
          "file_level_service_descriptors[$size$];\n",
          "size", SimpleItoa(file_->service_count()));
    }

    printer->Print(
      "\n"
      "}  // namespace\n"
      "\n");
  }

  // Define our externally-visible BuildDescriptors() function.  (For the lite
  // library, all this does is initialize default instances.)
  GenerateBuildDescriptors(printer);

  printer->Print(
      "\n"
      "}  // namespace $file_namespace$\n"
      "\n",
      "file_namespace", FileLevelNamespace(file_->name()));

  // Generate enums.
  for (int i = 0; i < enum_generators_.size(); i++) {
    enum_generators_[i]->GenerateMethods(printer);
  }

  // Generate classes.
  for (int i = 0; i < message_generators_.size(); i++) {
    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
    message_generators_[i]->GenerateClassMethods(printer);

    printer->Print("#if PROTOBUF_INLINE_NOT_IN_HEADERS\n");
    // Generate class inline methods.
    message_generators_[i]->GenerateInlineMethods(printer,
                                                  /* is_inline = */ false);
    printer->Print("#endif  // PROTOBUF_INLINE_NOT_IN_HEADERS\n");
  }

  if (HasGenericServices(file_, options_)) {
    // Generate services.
    for (int i = 0; i < service_generators_.size(); i++) {
      if (i == 0) printer->Print("\n");
      printer->Print(kThickSeparator);
      printer->Print("\n");
      service_generators_[i]->GenerateImplementation(printer);
    }
  }

  // Define extensions.
  for (int i = 0; i < extension_generators_.size(); i++) {
    extension_generators_[i]->GenerateDefinition(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(namespace_scope)\n");

  GenerateNamespaceClosers(printer);

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(global_scope)\n");
}